

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# builder.cpp
# Opt level: O1

Error __thiscall
asmjit::v1_14::BaseBuilder::embedConstPool(BaseBuilder *this,Label *label,ConstPool *pool)

{
  bool bVar1;
  Error EVar2;
  EmbedDataNode *in_RAX;
  EmbedDataNode *dst;
  EmbedDataNode *node;
  
  if ((this->super_BaseEmitter)._code == (CodeHolder *)0x0) {
    EVar2 = 5;
  }
  else {
    node = in_RAX;
    bVar1 = BaseEmitter::isLabelValid
                      (&this->super_BaseEmitter,(label->super_Operand).super_Operand_._baseId);
    if (!bVar1) {
      EVar2 = BaseEmitter::reportError(&this->super_BaseEmitter,0xc,(char *)0x0);
      return EVar2;
    }
    EVar2 = (*(this->super_BaseEmitter)._vptr_BaseEmitter[9])(this,1,(ulong)(uint)pool->_alignment);
    if (((EVar2 == 0) &&
        (EVar2 = (*(this->super_BaseEmitter)._vptr_BaseEmitter[6])(this,label), EVar2 == 0)) &&
       (EVar2 = newEmbedDataNode(this,&node,kUInt8,(void *)0x0,pool->_size,1), EVar2 == 0)) {
      if ((ulong)(byte)node[0x13] * *(long *)(node + 0x30) < 0x41) {
        dst = node + 0x40;
      }
      else {
        dst = *(EmbedDataNode **)(node + 0x40);
      }
      ConstPool::fill(pool,dst);
      addNode(this,(BaseNode *)node);
      EVar2 = 0;
    }
  }
  return EVar2;
}

Assistant:

Error BaseBuilder::embedConstPool(const Label& label, const ConstPool& pool) {
  if (ASMJIT_UNLIKELY(!_code))
    return DebugUtils::errored(kErrorNotInitialized);

  if (!isLabelValid(label))
    return reportError(DebugUtils::errored(kErrorInvalidLabel));

  ASMJIT_PROPAGATE(align(AlignMode::kData, uint32_t(pool.alignment())));
  ASMJIT_PROPAGATE(bind(label));

  EmbedDataNode* node;
  ASMJIT_PROPAGATE(newEmbedDataNode(&node, TypeId::kUInt8, nullptr, pool.size()));
  ASMJIT_ASSUME(node != nullptr);

  pool.fill(node->data());
  addNode(node);
  return kErrorOk;
}